

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::ClassExpr::ClassExpr
          (ClassExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *tokId,TemplateDecls *templs,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *constructAttributes,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *attributes,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  TemplateDecls *templs_local;
  Token *tokId_local;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Position *pos_local;
  Lexer *lexer_local;
  ClassExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_CLASS,pos);
  Capable::Capable(&this->super_Capable,caps);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ClassExpr_00176830;
  this->tokId = tokId;
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::vector(&this->templs,templs);
  std::__cxx11::
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  ::list(&this->constructAttributes,constructAttributes);
  std::__cxx11::
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  ::list(&this->attributes,attributes);
  std::__cxx11::
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ::list(&this->functions,functions);
  if (this->tokId != (Token *)0x0) {
    _setTemplateParents(&this->templs,&this->super_Expr);
    _setParents<pfederc::BiOpExpr>(&this->constructAttributes,&this->super_Expr);
    _setParents<pfederc::BiOpExpr>(&this->attributes,&this->super_Expr);
    _setParents<pfederc::FuncExpr>(&this->functions,&this->super_Expr);
    return;
  }
  __assert_fail("this->tokId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x18b,
                "pfederc::ClassExpr::ClassExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::list<std::unique_ptr<BiOpExpr>> &&, std::list<std::unique_ptr<BiOpExpr>> &&, std::list<std::unique_ptr<FuncExpr>> &&)"
               );
}

Assistant:

ClassExpr::ClassExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *tokId,
    TemplateDecls &&templs,
    std::list<std::unique_ptr<BiOpExpr>> &&constructAttributes,
    std::list<std::unique_ptr<BiOpExpr>> &&attributes,
    std::list<std::unique_ptr<FuncExpr>> &&functions) noexcept
    : Expr(lexer, ExprType::EXPR_CLASS, pos), Capable(std::move(caps)), tokId{tokId},
      templs(std::move(templs)),
      constructAttributes(std::move(constructAttributes)),
      attributes(std::move(attributes)),
      functions(std::move(functions)) {
  assert(this->tokId);

  _setTemplateParents(this->templs, this);
  _setParents(this->constructAttributes, this);
  _setParents(this->attributes, this);
  _setParents(this->functions, this);
}